

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall SQCompilation::CheckerVisitor::checkBitwiseToBool(CheckerVisitor *this,BinExpr *bin)

{
  Expr *pEVar1;
  Expr *pEVar2;
  ulong uVar3;
  int32_t local_20;
  int32_t local_1c;
  
  if ((this->effectsOnly != false) || (2 < (bin->super_Expr).super_Node._op - TO_OR)) {
    return;
  }
  pEVar1 = maybeEval(this,bin->_lhs,&local_20,false);
  pEVar2 = maybeEval(this,bin->_rhs,&local_1c,false);
  do {
    uVar3 = (ulong)(pEVar1->super_Node)._op;
    if (0x39 < uVar3) {
LAB_001505eb:
      while( true ) {
        uVar3 = (ulong)(pEVar2->super_Node)._op;
        if (0x39 < uVar3) {
          return;
        }
        if ((0x680000UL >> (uVar3 & 0x3f) & 1) == 0) break;
        pEVar2 = *(Expr **)&pEVar2[1].super_Node._coordinates;
      }
      if ((0x20003ec000000U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 != 0x39) {
          return;
        }
        if (*(int *)&(pEVar2->super_Node).field_0x1c != 3) {
          return;
        }
      }
LAB_001505be:
      report(this,(Node *)bin,0x3c);
      return;
    }
    if ((0x680000UL >> (uVar3 & 0x3f) & 1) == 0) {
      if (((0x20003ec000000U >> (uVar3 & 0x3f) & 1) != 0) ||
         ((uVar3 == 0x39 && (*(int *)&(pEVar1->super_Node).field_0x1c == 3)))) goto LAB_001505be;
      goto LAB_001505eb;
    }
    pEVar1 = *(Expr **)&pEVar1[1].super_Node._coordinates;
  } while( true );
}

Assistant:

void CheckerVisitor::checkBitwiseToBool(const BinExpr *bin) {

  if (effectsOnly)
    return;

  if (!isBitwiseOperator(bin->op()))
    return;

  const Expr *lhs = maybeEval(bin->lhs());
  const Expr *rhs = maybeEval(bin->rhs());

  if (looksLikeBooleanExpr(lhs) || looksLikeBooleanExpr(rhs)) {
    report(bin, DiagnosticsId::DI_BITWISE_OP_TO_BOOL);
  }

}